

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdGetTxInWitnessCountByHandle
              (void *handle,void *tx_data_handle,int stack_type,uint32_t txin_index,uint32_t *count)

{
  ConfidentialTransaction *this;
  uint32_t uVar1;
  CfdException *pCVar2;
  ScriptWitness *this_00;
  allocator local_1ae;
  bool is_bitcoin;
  int stack_type_local;
  undefined1 local_1a8 [32];
  TxInReference ref;
  ScriptWitness local_48;
  
  stack_type_local = stack_type;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&ref,"TransactionData",(allocator *)local_1a8);
  cfd::capi::CheckBuffer(tx_data_handle,(string *)&ref);
  std::__cxx11::string::~string((string *)&ref);
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&is_bitcoin);
  this = *(ConfidentialTransaction **)((long)tx_data_handle + 0x18);
  if (this == (ConfidentialTransaction *)0x0) {
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ref,"Invalid handle state. tx is null",(allocator *)local_1a8);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&ref);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (is_bitcoin == true) {
    cfd::core::Transaction::GetTxIn(&ref,(Transaction *)this,txin_index);
    if (stack_type_local == 0) {
      if (count != (uint32_t *)0x0) {
        uVar1 = cfd::core::ScriptWitness::GetWitnessNum
                          (&ref.super_AbstractTxInReference.script_witness_);
        *count = uVar1;
      }
      cfd::core::AbstractTxInReference::~AbstractTxInReference(&ref.super_AbstractTxInReference);
      return 0;
    }
    local_1a8._0_8_ = "cfdcapi_transaction.cpp";
    local_1a8._8_4_ = 0xf51;
    local_1a8._16_8_ = "CfdGetTxInWitnessCountByHandle";
    cfd::core::logger::warn<int&>
              ((CfdSourceLocation *)local_1a8,"Invalid stack type[{}]",&stack_type_local);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)local_1a8,"Invalid stack type.",&local_1ae);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::ConfidentialTransaction::GetTxIn((ConfidentialTxInReference *)&ref,this,txin_index);
  if (stack_type_local == 1) {
    if (count == (uint32_t *)0x0) goto LAB_003a26ec;
    this_00 = &local_48;
  }
  else {
    if (stack_type_local != 0) {
      local_1a8._0_8_ = "cfdcapi_transaction.cpp";
      local_1a8._8_4_ = 0xf60;
      local_1a8._16_8_ = "CfdGetTxInWitnessCountByHandle";
      cfd::core::logger::warn<int&>
                ((CfdSourceLocation *)local_1a8,"Invalid stack type[{}]",&stack_type_local);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)local_1a8,"Invalid stack type.",&local_1ae);
      cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1a8);
      __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (count == (uint32_t *)0x0) goto LAB_003a26ec;
    this_00 = &ref.super_AbstractTxInReference.script_witness_;
  }
  uVar1 = cfd::core::ScriptWitness::GetWitnessNum(this_00);
  *count = uVar1;
LAB_003a26ec:
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)&ref);
  return 0;
}

Assistant:

int CfdGetTxInWitnessCountByHandle(
    void* handle, void* tx_data_handle, int stack_type, uint32_t txin_index,
    uint32_t* count) {
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      const TxInReference ref = tx->GetTxIn(txin_index);
      if (stack_type != kCfdTxWitnessStackNormal) {
        warn(CFD_LOG_SOURCE, "Invalid stack type[{}]", stack_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Invalid stack type.");
      }
      if (count != nullptr) *count = ref.GetScriptWitnessStackNum();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      const ConfidentialTxInReference ref = tx->GetTxIn(txin_index);
      if (stack_type == kCfdTxWitnessStackNormal) {
        if (count != nullptr) *count = ref.GetScriptWitnessStackNum();
      } else if (stack_type == kCfdTxWitnessStackPegin) {
        if (count != nullptr) *count = ref.GetPeginWitnessStackNum();
      } else {
        warn(CFD_LOG_SOURCE, "Invalid stack type[{}]", stack_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Invalid stack type.");
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}